

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O2

void __thiscall Rotation::Rotation(Rotation *this,Vec2d *pivotPoint,float angle)

{
  Vec2d *this_00;
  
  (this->super_Transformation)._vptr_Transformation = (_func_int **)&PTR__Rotation_00130c70;
  this->type = ROTATION;
  this->pivotPoint = (Vec2d *)0x0;
  this->angleDegrees = angle;
  this->angleRadians = (angle * 3.1415927) / 180.0;
  this_00 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_00,pivotPoint);
  this->pivotPoint = this_00;
  return;
}

Assistant:

Rotation::Rotation(Vec2d* pivotPoint, float angle) {
    this->angleDegrees = angle;
    this->angleRadians = angle * M_PI / 180;
    this->pivotPoint = new Vec2d(pivotPoint);
}